

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O1

void __thiscall
gl3cts::TransformFeedback::QueryGeometryInterleaved::clean(QueryGeometryInterleaved *this)

{
  clean((QueryGeometryInterleaved *)
        ((long)&(this->super_CaptureGeometryInterleaved)._vptr_CaptureGeometryInterleaved +
        (long)(this->super_CaptureGeometryInterleaved)._vptr_CaptureGeometryInterleaved[-0xe]));
  return;
}

Assistant:

void gl3cts::TransformFeedback::QueryGeometryInterleaved::clean(void)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Delete query object. */
	gl.deleteQueries(1, &m_query_object);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteQueries call failed.");

	/* Other. */
	gl3cts::TransformFeedback::CaptureGeometryInterleaved::clean();
}